

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O3

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
find_a_zero(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
            *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *cost_matrix,unsigned_long *matrix_size,
           vector<double,_std::allocator<double>_> *row_cover,
           vector<double,_std::allocator<double>_> *col_cover,int *row,int *col)

{
  double dVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  
  *row = -1;
  *col = -1;
  uVar2 = *matrix_size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      uVar4 = 0;
      do {
        dVar1 = *(double *)
                 (*(long *)&(cost_matrix->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar3].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + uVar4 * 8);
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
            (dVar1 = (row_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar3], dVar1 == 0.0)) &&
           (((!NAN(dVar1) &&
             (dVar1 = (col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar4], dVar1 == 0.0)) && (!NAN(dVar1))))) {
          *row = (int)uVar3;
          *col = (int)uVar4;
          return;
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::find_a_zero(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    int& row, int& col)
{
  row = -1;
  col = -1;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] == 0 && row_cover[r] == 0 && col_cover[c] == 0)
      {
        row = r;
        col = c;
        return;
      }
    }
  }
}